

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

bool __thiscall
ThreadedReplayer::derived_work_item_is_satisfied<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,DeferredGraphicsInfo *info,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  bool bVar1;
  const_iterator cVar2;
  int *piVar3;
  ulong uVar4;
  key_type kStack_28;
  
  if (info->info == (VkGraphicsPipelineCreateInfo *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    for (piVar3 = (int *)info->info->pNext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9f36d0) {
        if (piVar3[4] == 0) {
          return true;
        }
        uVar4 = 0;
        do {
          kStack_28 = *(key_type *)(*(long *)(piVar3 + 6) + uVar4 * 8);
          cVar2 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&pipelines->_M_h,&kStack_28);
          bVar1 = cVar2.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
                  _M_cur != (__node_type *)0x0;
          if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            return bVar1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (uint)piVar3[4]);
        return bVar1;
      }
    }
  }
  return bVar1;
}

Assistant:

bool derived_work_item_is_satisfied(const DerivedInfo &info,
	                                    const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		if (!info.info)
			return false;
		auto *library = work_item_get_library_info(info);
		return !library || pipeline_library_info_is_satisfied(*library, pipelines);
	}